

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O1

grid_iterator<signed_char> *
idx2::End<signed_char>(grid_iterator<signed_char> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  long lVar2;
  
  __return_storage_ptr__->Ptr = (char *)0x0;
  uVar1 = (Grid->super_extent).From;
  lVar2 = (long)(Vol->Dims << 0x2b) >> 0x2b;
  __return_storage_ptr__->Ptr =
       (char *)((Vol->Buffer).Data +
               ((long)(uVar1 << 0x16) >> 0x2b) * lVar2 + ((long)(uVar1 << 0x2b) >> 0x2b) +
               ((long)(Vol->Dims << 0x16) >> 0x2b) * lVar2 *
               (long)((int)((long)(uVar1 * 2) >> 0x2b) +
                     (int)((long)(Grid->Strd * 2) >> 0x2b) *
                     (int)((long)((Grid->super_extent).Dims * 2) >> 0x2b)));
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
End(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  v3i To3 = From(Grid) + v3i(0, 0, Dims(Grid).Z * Strd(Grid).Z);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Dims(Vol), To3);
  return Iter;
}